

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O2

int h265_read_nal_unit(h265_stream_t *h,uint8_t *buf,int size)

{
  h265_nal_t *phVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  int iVar5;
  bs_t *pbVar6;
  uint8_t *rbsp_buf;
  FILE *pFVar7;
  char *__ptr;
  size_t sStack_50;
  int rbsp_size;
  int nal_size;
  
  phVar1 = h->nal;
  pbVar6 = bs_new(buf,(long)size);
  uVar4 = bs_read_u(pbVar6,1);
  phVar1->forbidden_zero_bit = uVar4;
  uVar4 = bs_read_u(pbVar6,6);
  phVar1->nal_unit_type = uVar4;
  uVar4 = bs_read_u(pbVar6,6);
  phVar1->nuh_layer_id = uVar4;
  uVar4 = bs_read_u(pbVar6,3);
  phVar1->nuh_temporal_id_plus1 = uVar4;
  phVar1->parsed = (void *)0x0;
  phVar1->sizeof_parsed = 0;
  free(pbVar6);
  rbsp_size = size;
  nal_size = size;
  rbsp_buf = (uint8_t *)malloc((long)size);
  iVar5 = nal_to_rbsp(2,buf,&nal_size,rbsp_buf,&rbsp_size);
  if (iVar5 < 0) {
    free(rbsp_buf);
    goto LAB_00109106;
  }
  pbVar6 = bs_new(rbsp_buf,(long)rbsp_size);
  pFVar7 = (FILE *)h265_dbgfile;
  switch(phVar1->nal_unit_type) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    h265_read_slice_header(h,pbVar6);
    phVar1->parsed = h->sh;
    phVar1->sizeof_parsed = 0x660;
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    if (h265_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    __ptr = "Note: found reserved VCL NAL unit.\n";
    sStack_50 = 0x23;
    goto LAB_001090d0;
  case 0x20:
    h265_read_vps_rbsp(h,pbVar6);
    break;
  case 0x21:
    h265_read_sps_rbsp(h,pbVar6);
    phVar1->parsed = h->sps;
    phVar1->sizeof_parsed = 0x1ef8;
    break;
  case 0x22:
    h265_read_pps_rbsp(h,pbVar6);
    phVar1->parsed = h->pps;
    phVar1->sizeof_parsed = 0x1a08;
    break;
  case 0x23:
    h265_read_aud_rbsp(h,pbVar6);
    phVar1->parsed = h->aud;
    phVar1->sizeof_parsed = 1;
    break;
  case 0x24:
  case 0x25:
    break;
  default:
    phVar1->parsed = (void *)0x0;
    phVar1->sizeof_parsed = 0;
    return 0;
  case 0x27:
  case 0x28:
    h265_read_sei_rbsp(h,pbVar6);
    phVar1->parsed = h->sei;
    phVar1->sizeof_parsed = 0x10;
    break;
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    if (h265_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    __ptr = "Note: found reserved NAL unit.\n";
    sStack_50 = 0x1f;
    goto LAB_001090d0;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
    if (h265_dbgfile == (FILE *)0x0) {
      pFVar7 = _stdout;
    }
    __ptr = "Note: found unspecified NAL unit.\n";
    sStack_50 = 0x22;
LAB_001090d0:
    fwrite(__ptr,sStack_50,1,pFVar7);
    phVar1->parsed = (void *)0x0;
    phVar1->sizeof_parsed = 0;
  }
  puVar2 = pbVar6->p;
  puVar3 = pbVar6->end;
  free(pbVar6);
  free(rbsp_buf);
  if (puVar3 < puVar2) {
LAB_00109106:
    nal_size = -1;
  }
  return nal_size;
}

Assistant:

int h265_read_nal_unit(h265_stream_t* h, uint8_t* buf, int size)
{
    h265_nal_t* nal = h->nal;

    bs_t* b = bs_new(buf, size);
    // nal header
    nal->forbidden_zero_bit = bs_read_f(b,1);
    nal->nal_unit_type = bs_read_u(b,6);
    nal->nuh_layer_id = bs_read_u(b,6);
    nal->nuh_temporal_id_plus1 = bs_read_u(b,3);
    nal->parsed = NULL;
    nal->sizeof_parsed = 0;
    bs_free(b);

    int nal_size = size;
    int rbsp_size = size;
    uint8_t* rbsp_buf = (uint8_t*)malloc(rbsp_size);

    int rc = nal_to_rbsp(2, buf, &nal_size, rbsp_buf, &rbsp_size);

    if (rc < 0) { free(rbsp_buf); return -1; } // handle conversion error

    b = bs_new(rbsp_buf, rbsp_size);

    // nal data
    switch ( nal->nal_unit_type )
    {
        case NAL_UNIT_VPS:
            h265_read_vps_rbsp(h,b);
            break;
        case NAL_UNIT_SPS:
            h265_read_sps_rbsp(h, b);
            nal->parsed = h->sps;
            nal->sizeof_parsed = sizeof(h265_sps_t);
            break;
        case NAL_UNIT_PPS:
            h265_read_pps_rbsp(h, b);
            nal->parsed = h->pps;
            nal->sizeof_parsed = sizeof(h265_pps_t);
            break;
        case NAL_UNIT_PREFIX_SEI:
            h265_read_sei_rbsp(h, b);
            nal->parsed = h->sei;
            nal->sizeof_parsed = sizeof(h265_sei_t);
            break;
        case NAL_UNIT_SUFFIX_SEI:
            h265_read_sei_rbsp(h, b);
            nal->parsed = h->sei;
            nal->sizeof_parsed = sizeof(h265_sei_t);
            break;
        case NAL_UNIT_AUD:
            h265_read_aud_rbsp(h, b);
            nal->parsed = h->aud;
            nal->sizeof_parsed = sizeof(h265_aud_t);
            break;
        case NAL_UNIT_EOS:
            h265_read_end_of_seq_rbsp(h, b);
            break;
        case NAL_UNIT_EOB:
            h265_read_end_of_stream_rbsp(h, b);
            break;
        case NAL_UNIT_CODED_SLICE_TRAIL_N:
        case NAL_UNIT_CODED_SLICE_TRAIL_R:
        case NAL_UNIT_CODED_SLICE_TSA_N:
        case NAL_UNIT_CODED_SLICE_TSA_R:
        case NAL_UNIT_CODED_SLICE_STSA_N:
        case NAL_UNIT_CODED_SLICE_STSA_R:
        case NAL_UNIT_CODED_SLICE_RADL_N:
        case NAL_UNIT_CODED_SLICE_RADL_R:
        case NAL_UNIT_CODED_SLICE_RASL_N:
        case NAL_UNIT_CODED_SLICE_RASL_R:
        case NAL_UNIT_CODED_SLICE_BLA_W_LP:
        case NAL_UNIT_CODED_SLICE_BLA_W_RADL:
        case NAL_UNIT_CODED_SLICE_BLA_N_LP:
        case NAL_UNIT_CODED_SLICE_IDR_W_RADL:
        case NAL_UNIT_CODED_SLICE_IDR_N_LP:
        case NAL_UNIT_CODED_SLICE_CRA:
            h265_read_slice_layer_rbsp(h, b);
            nal->parsed = h->sh;
            nal->sizeof_parsed = sizeof(h265_slice_header_t);
            break;
        case NAL_UNIT_RESERVED_VCL_N10:
        case NAL_UNIT_RESERVED_VCL_R11:
        case NAL_UNIT_RESERVED_VCL_N12:
        case NAL_UNIT_RESERVED_VCL_R13:
        case NAL_UNIT_RESERVED_VCL_N14:
        case NAL_UNIT_RESERVED_VCL_R15:

        case NAL_UNIT_RESERVED_IRAP_VCL22:
        case NAL_UNIT_RESERVED_IRAP_VCL23:

        case NAL_UNIT_RESERVED_VCL24:
        case NAL_UNIT_RESERVED_VCL25:
        case NAL_UNIT_RESERVED_VCL26:
        case NAL_UNIT_RESERVED_VCL27:
        case NAL_UNIT_RESERVED_VCL28:
        case NAL_UNIT_RESERVED_VCL29:
        case NAL_UNIT_RESERVED_VCL30:
        case NAL_UNIT_RESERVED_VCL31:
            printf ("Note: found reserved VCL NAL unit.\n");
            nal->parsed = NULL;
            nal->sizeof_parsed = 0;
            break;
        case NAL_UNIT_RESERVED_NVCL41:
        case NAL_UNIT_RESERVED_NVCL42:
        case NAL_UNIT_RESERVED_NVCL43:
        case NAL_UNIT_RESERVED_NVCL44:
        case NAL_UNIT_RESERVED_NVCL45:
        case NAL_UNIT_RESERVED_NVCL46:
        case NAL_UNIT_RESERVED_NVCL47:
            printf ("Note: found reserved NAL unit.\n");
            nal->parsed = NULL;
            nal->sizeof_parsed = 0;
            break;
        case NAL_UNIT_UNSPECIFIED_48:
        case NAL_UNIT_UNSPECIFIED_49:
        case NAL_UNIT_UNSPECIFIED_50:
        case NAL_UNIT_UNSPECIFIED_51:
        case NAL_UNIT_UNSPECIFIED_52:
        case NAL_UNIT_UNSPECIFIED_53:
        case NAL_UNIT_UNSPECIFIED_54:
        case NAL_UNIT_UNSPECIFIED_55:
        case NAL_UNIT_UNSPECIFIED_56:
        case NAL_UNIT_UNSPECIFIED_57:
        case NAL_UNIT_UNSPECIFIED_58:
        case NAL_UNIT_UNSPECIFIED_59:
        case NAL_UNIT_UNSPECIFIED_60:
        case NAL_UNIT_UNSPECIFIED_61:
        case NAL_UNIT_UNSPECIFIED_62:
        case NAL_UNIT_UNSPECIFIED_63:
            printf ("Note: found unspecified NAL unit.\n");
            nal->parsed = NULL;
            nal->sizeof_parsed = 0;
            break;
        default:
            // here comes the reserved/unspecified/ignored stuff
            nal->parsed = NULL;
            nal->sizeof_parsed = 0;
            return 0;
    }

    if (bs_overrun(b)) { bs_free(b); free(rbsp_buf); return -1; }

    bs_free(b);
    free(rbsp_buf);

    return nal_size;
}